

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_msa(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGv_ptr pTVar1;
  target_ulong tVar2;
  uint uVar3;
  uintptr_t o_29;
  TCGv_i32 pTVar4;
  TCGTemp *pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i32 pTVar7;
  TCGv_i32 pTVar8;
  ulong uVar9;
  TCGv_i32 pTVar10;
  uintptr_t o_307;
  TCGv_i64 pTVar11;
  uintptr_t o_310;
  TCGContext_conflict6 *tcg_ctx;
  uint uVar12;
  int iVar13;
  uintptr_t o_43;
  int32_t val;
  TCGOpcode opc;
  code *pcVar14;
  uintptr_t o_19;
  uintptr_t o_45;
  uintptr_t o;
  uint val_00;
  uint uVar15;
  uintptr_t o_1;
  uintptr_t o_351;
  TCGv_i32 local_78;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGv_i64 local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_38;
  
  tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
  tVar2 = (env->active_tc).gpr[7];
  if ((*(byte *)((long)(env->active_tc).gpr + 0x45) & 2) == 0) {
    ctx = (DisasContext_conflict6 *)0x14;
    generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
  }
  uVar12 = (uint)(env->active_tc).gpr[0xc];
  if ((uVar12 & 0x60) == 0x20) {
    ctx = (DisasContext_conflict6 *)0x14;
LAB_009b6ced:
    generate_exception_err((DisasContext_conflict6 *)env,(int)ctx,0);
  }
  else if ((uVar12 >> 0x18 & 1) == 0) {
    ctx = (DisasContext_conflict6 *)0x22;
    if (((env->active_tc).gpr[8] & 0x20000000000) == 0) {
      ctx = (DisasContext_conflict6 *)0x14;
    }
    goto LAB_009b6ced;
  }
  uVar12 = (uint)tVar2 & 0xfc00003f;
  switch(uVar12) {
  case 0x78000000:
  case 0x78000001:
  case 0x78000002:
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
    pTVar10 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & 0xff);
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar12 & 0xff00003f;
    if (0x79000001 < (int)uVar3) {
      if (0x7a000000 < (int)uVar3) {
        if (uVar3 == 0x7a000001) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_bseli_b_mips64el;
        }
        else {
          if (uVar3 == 0x7a000002) goto LAB_009b4bed;
          if (uVar3 != 0x7b000000) goto LAB_009b4bfc;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_xori_b_mips64el;
        }
        goto LAB_009b5047;
      }
      if (uVar3 != 0x79000002) {
        if (uVar3 != 0x7a000000) goto LAB_009b4bfc;
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_nori_b_mips64el;
        goto LAB_009b5047;
      }
LAB_009b4bed:
      uVar12 = uVar12 >> 0x18 & 3;
      if (uVar12 == 3) {
LAB_009b4bfc:
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        break;
      }
      pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar12);
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar5 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      local_58 = (TCGv_i64)(pTVar7 + (long)&tcg_ctx->pool_cur);
      local_50 = pTVar8 + (long)&tcg_ctx->pool_cur;
      local_48 = pTVar10 + (long)&tcg_ctx->pool_cur;
      local_60 = pTVar5;
      tcg_gen_callN_mips64el(tcg_ctx,helper_msa_shf_df_mips64el,(TCGTemp *)0x0,5,&local_68);
      goto LAB_009b4d9c;
    }
    if ((int)uVar3 < 0x78000002) {
      if (uVar3 == 0x78000000) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_andi_b_mips64el;
      }
      else {
        if (uVar3 != 0x78000001) goto LAB_009b4bfc;
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_bmnzi_b_mips64el;
      }
    }
    else {
      if (uVar3 == 0x78000002) goto LAB_009b4bed;
      if (uVar3 == 0x79000000) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_ori_b_mips64el;
      }
      else {
        if (uVar3 != 0x79000001) goto LAB_009b4bfc;
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_bmzi_b_mips64el;
      }
    }
LAB_009b5047:
    local_50 = pTVar10 + (long)&tcg_ctx->pool_cur;
    local_58 = (TCGv_i64)(pTVar8 + (long)&tcg_ctx->pool_cur);
    local_60 = (TCGTemp *)(pTVar7 + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,4,&local_68);
    break;
  default:
    goto switchD_009b42d5_caseD_78000003;
  case 0x78000006:
  case 0x78000007:
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    iVar13 = (int)(uVar12 << 0xb) >> 0x1b;
    local_38 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x15 & 3);
    pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
    local_78 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
    pTVar5 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar12 >> 0x10 & 0x1f));
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar12 & 0xff80003f;
    if ((int)uVar3 < 0x79800007) {
      if ((int)uVar3 < 0x79000006) {
        if (uVar3 == 0x78000006) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
          pcVar14 = helper_msa_addvi_df_mips64el;
        }
        else if (uVar3 == 0x78000007) {
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)iVar13);
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
          pcVar14 = helper_msa_ceqi_df_mips64el;
        }
        else {
          if (uVar3 != 0x78800006) {
LAB_009b57ca:
            generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
            pTVar4 = local_38;
            goto LAB_009b57b7;
          }
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
          pcVar14 = helper_msa_subvi_df_mips64el;
        }
      }
      else if (uVar3 == 0x79000006) {
        tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)iVar13);
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
        pcVar14 = helper_msa_maxi_s_df_mips64el;
      }
      else if (uVar3 == 0x79000007) {
        tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)iVar13);
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
        pcVar14 = helper_msa_clti_s_df_mips64el;
      }
      else {
        if (uVar3 != 0x79800006) goto LAB_009b57ca;
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
        pcVar14 = helper_msa_maxi_u_df_mips64el;
      }
LAB_009b57a8:
      pTVar4 = local_38;
      local_48 = (TCGv_i32)((long)tcg_ctx + (long)pTVar8);
      local_50 = local_78 + (long)&tcg_ctx->pool_cur;
      local_58 = (TCGv_i64)(pTVar7 + (long)&tcg_ctx->pool_cur);
      tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,5,&local_68);
    }
    else {
      if ((int)uVar3 < 0x7a800006) {
        if (uVar3 == 0x79800007) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
          pcVar14 = helper_msa_clti_u_df_mips64el;
        }
        else if (uVar3 == 0x7a000006) {
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)iVar13);
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
          pcVar14 = helper_msa_mini_s_df_mips64el;
        }
        else {
          if (uVar3 != 0x7a000007) goto LAB_009b57ca;
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)iVar13);
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
          pcVar14 = helper_msa_clei_s_df_mips64el;
        }
        goto LAB_009b57a8;
      }
      if (uVar3 == 0x7a800006) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
        pcVar14 = helper_msa_mini_u_df_mips64el;
        goto LAB_009b57a8;
      }
      if (uVar3 == 0x7a800007) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
        pcVar14 = helper_msa_clei_u_df_mips64el;
        goto LAB_009b57a8;
      }
      if (uVar3 != 0x7b000007) goto LAB_009b57ca;
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)((int)(uVar12 << 0xb) >> 0x16));
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_60 = (TCGTemp *)(local_38 + (long)&tcg_ctx->pool_cur);
      local_58 = (TCGv_i64)(pTVar7 + (long)&tcg_ctx->pool_cur);
      local_50 = (TCGv_i32)((long)tcg_ctx + (long)pTVar8);
      pcVar14 = helper_msa_ldi_df_mips64el;
      pTVar4 = local_38;
LAB_009b4cf2:
      iVar13 = 4;
LAB_009b7273:
      tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,iVar13,&local_68);
    }
LAB_009b57b7:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
LAB_009b613d:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    pTVar5 = (TCGTemp *)(local_78 + (long)tcg_ctx);
    goto LAB_009b6154;
  case 0x78000009:
  case 0x7800000a:
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    if ((uVar12 >> 0x16 & 1) == 0) {
      val = 3;
      uVar3 = 0x3f;
    }
    else if ((uVar12 & 0x600000) == 0x400000) {
      val = 2;
      uVar3 = 0x1f;
    }
    else if ((uVar12 & 0x700000) == 0x600000) {
      val = 1;
      uVar3 = 0xf;
    }
    else {
      if ((uVar12 & 0x780000) != 0x700000) goto switchD_009b42d5_caseD_78000003;
      val = 0;
      uVar3 = 7;
    }
    pTVar4 = tcg_const_i32_mips64el(tcg_ctx,val);
    pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & uVar3);
    pTVar10 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
    uVar12 = (uint)(env->active_tc).gpr[7] & 0xff80003f;
    if ((int)uVar12 < 0x79800009) {
      if (0x78800009 < (int)uVar12) {
        if (uVar12 == 0x7880000a) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_sat_u_df_mips64el;
        }
        else if (uVar12 == 0x79000009) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_srli_df_mips64el;
        }
        else {
          if (uVar12 != 0x7900000a) goto LAB_009b5ca5;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_srari_df_mips64el;
        }
        goto LAB_009b5c6c;
      }
      if (uVar12 == 0x78000009) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_slli_df_mips64el;
        goto LAB_009b5c6c;
      }
      if (uVar12 == 0x7800000a) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_sat_s_df_mips64el;
        goto LAB_009b5c6c;
      }
      if (uVar12 == 0x78800009) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_srai_df_mips64el;
        goto LAB_009b5c6c;
      }
LAB_009b5ca5:
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    }
    else {
      if ((int)uVar12 < 0x7a800009) {
        if (uVar12 == 0x79800009) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_bclri_df_mips64el;
        }
        else if (uVar12 == 0x7980000a) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_srlri_df_mips64el;
        }
        else {
          if (uVar12 != 0x7a000009) goto LAB_009b5ca5;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_bseti_df_mips64el;
        }
      }
      else if (uVar12 == 0x7a800009) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_bnegi_df_mips64el;
      }
      else if (uVar12 == 0x7b000009) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_binsli_df_mips64el;
      }
      else {
        if (uVar12 != 0x7b800009) goto LAB_009b5ca5;
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_binsri_df_mips64el;
      }
LAB_009b5c6c:
      local_48 = pTVar7 + (long)&tcg_ctx->pool_cur;
      local_50 = pTVar8 + (long)&tcg_ctx->pool_cur;
      local_58 = (TCGv_i64)(pTVar10 + (long)&tcg_ctx->pool_cur);
      local_60 = (TCGTemp *)(pTVar4 + (long)&tcg_ctx->pool_cur);
      tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,5,&local_68);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    pTVar5 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
LAB_009b6154:
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar5);
    pTVar5 = (TCGTemp *)(pTVar8 + (long)tcg_ctx);
    goto LAB_009b69ae;
  case 0x7800000d:
  case 0x7800000e:
  case 0x7800000f:
  case 0x78000010:
  case 0x78000011:
  case 0x78000012:
  case 0x78000013:
  case 0x78000014:
  case 0x78000015:
    gen_msa_3r(env,ctx);
    return;
  case 0x78000019:
    uVar12 = (uint)(env->active_tc).gpr[7];
    if ((uVar12 & 0x300000) == 0) {
      uVar15 = 0;
      uVar3 = 0xf;
    }
    else if ((uVar12 & 0x380000) == 0x200000) {
      uVar15 = 1;
      uVar3 = 7;
    }
    else if ((uVar12 & 0x3c0000) == 0x300000) {
      uVar15 = 2;
      uVar3 = 3;
    }
    else {
      if ((uVar12 & 0x3e0000) != 0x380000) {
        if ((uVar12 & 0x3f0000) != 0x3e0000) goto switchD_009b42d5_caseD_78000003;
        tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
        uVar3 = uVar12 >> 0xb & 0x1f;
        uVar15 = uVar12 >> 6 & 0x1f;
        pTVar5 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
        pTVar6 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
        pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar3);
        pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar15);
        uVar12 = (uint)(env->active_tc).gpr[7] & 0xffff003f;
        if (uVar12 == 0x78be0019) {
          pTVar1 = tcg_ctx->cpu_env;
          pcVar14 = helper_msa_move_v_mips64el;
          pTVar11 = (TCGv_i64)pTVar7;
          pTVar8 = pTVar4;
LAB_009b72bd:
          local_58 = (TCGv_i64)(pTVar8 + (long)&tcg_ctx->pool_cur);
          local_60 = (TCGTemp *)(pTVar11 + (long)&tcg_ctx->pool_cur);
          local_68 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
          tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,3,&local_68);
        }
        else if (uVar12 == 0x787e0019) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(pTVar4 + (long)&tcg_ctx->pool_cur);
          tcg_gen_callN_mips64el
                    (tcg_ctx,helper_msa_cfcmsa_mips64el,(TCGTemp *)((long)tcg_ctx + (long)pTVar6),2,
                     &local_68);
          if ((uVar15 != 0) && (tcg_ctx->cpu_gpr[uVar15] != pTVar6)) {
            tcg_gen_op2_mips64el
                      (tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_gpr[uVar15] + (long)tcg_ctx),
                       (TCGArg)pTVar5);
          }
        }
        else {
          if (uVar12 == 0x783e0019) {
            if (uVar3 == 0) {
              opc = INDEX_op_movi_i64;
              pTVar11 = (TCGv_i64)0x0;
LAB_009b728f:
              tcg_gen_op2_mips64el(tcg_ctx,opc,(TCGArg)pTVar5,(TCGArg)pTVar11);
            }
            else if (tcg_ctx->cpu_gpr[uVar3] != pTVar6) {
              pTVar11 = tcg_ctx->cpu_gpr[uVar3] + (long)tcg_ctx;
              opc = INDEX_op_mov_i64;
              goto LAB_009b728f;
            }
            pTVar1 = tcg_ctx->cpu_env;
            pcVar14 = helper_msa_ctcmsa_mips64el;
            pTVar11 = pTVar6;
            pTVar8 = pTVar7;
            goto LAB_009b72bd;
          }
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        }
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
        pTVar5 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        goto LAB_009b69ae;
      }
      uVar15 = 3;
      uVar3 = 1;
    }
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    val_00 = uVar12 >> 6 & 0x1f;
    pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
    pTVar7 = tcg_const_i32_mips64el(tcg_ctx,val_00);
    pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & uVar3);
    local_38 = tcg_const_i32_mips64el(tcg_ctx,uVar15);
    uVar12 = (uint)(env->active_tc).gpr[7] & 0xffc0003f;
    switch((ulong)uVar12 - 0x78000019 << 0x2a | (ulong)uVar12 - 0x78000019 >> 0x16) {
    case 0:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_sldi_df_mips64el;
      break;
    case 1:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_splati_df_mips64el;
      break;
    case 2:
    case 3:
    case 4:
      if (uVar12 == 0x79000019) {
        (*(code *)(&DAT_00da9b38 + *(int *)(&DAT_00da9b38 + (ulong)uVar15 * 4)))();
        return;
      }
      if (uVar12 == 0x78c00019) {
        if (val_00 != 0) {
          (*(code *)(&DAT_00da9b48 + *(int *)(&DAT_00da9b48 + (ulong)uVar15 * 4)))();
          return;
        }
      }
      else if ((uVar12 == 0x78800019) && (val_00 != 0)) {
        (*(code *)(&DAT_00da9b58 + *(int *)(&DAT_00da9b58 + (ulong)uVar15 * 4)))();
        return;
      }
      goto LAB_009b6ba5;
    case 5:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_insve_df_mips64el;
      break;
    default:
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      goto LAB_009b6ba5;
    }
    local_48 = pTVar8 + (long)&tcg_ctx->pool_cur;
    local_50 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_58 = (TCGv_i64)(pTVar7 + (long)tcg_ctx);
    local_60 = (TCGTemp *)(local_38 + (long)tcg_ctx);
    tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,5,&local_68);
LAB_009b6ba5:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar8 + (long)tcg_ctx));
    pTVar5 = (TCGTemp *)(local_38 + (long)tcg_ctx);
    goto LAB_009b69ae;
  case 0x7800001a:
  case 0x7800001b:
  case 0x7800001c:
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar12 >> 0x15 & 1;
    pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
    pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & 0x1f);
    pTVar5 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
    pTVar6 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)uVar3 + 2);
    uVar12 = (uint)(env->active_tc).gpr[7] & 0xffc0003f;
    if ((int)uVar12 < 0x79c0001b) {
      if ((int)uVar12 < 0x78c0001c) {
        if ((int)uVar12 < 0x7880001a) {
          if ((int)uVar12 < 0x7840001a) {
            if (uVar12 == 0x7800001a) {
              local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
              pcVar14 = helper_msa_fcaf_df_mips64el;
            }
            else {
              if (uVar12 != 0x7800001b) goto LAB_009b69c2;
              local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
              pcVar14 = helper_msa_fadd_df_mips64el;
            }
          }
          else if (uVar12 == 0x7840001a) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fcun_df_mips64el;
          }
          else if (uVar12 == 0x7840001b) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fsub_df_mips64el;
          }
          else {
            if (uVar12 != 0x7840001c) goto LAB_009b69c2;
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fcor_df_mips64el;
          }
        }
        else if ((int)uVar12 < 0x7880001c) {
          if (uVar12 == 0x7880001a) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fceq_df_mips64el;
          }
          else {
            if (uVar12 != 0x7880001b) goto LAB_009b69c2;
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fmul_df_mips64el;
          }
        }
        else if (uVar12 == 0x7880001c) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fcune_df_mips64el;
        }
        else if (uVar12 == 0x78c0001a) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fcueq_df_mips64el;
        }
        else {
          if (uVar12 != 0x78c0001b) goto LAB_009b69c2;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fdiv_df_mips64el;
        }
      }
      else if ((int)uVar12 < 0x7940001b) {
        if ((int)uVar12 < 0x7900001b) {
          if (uVar12 == 0x78c0001c) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fcne_df_mips64el;
          }
          else {
            if (uVar12 != 0x7900001a) goto LAB_009b69c2;
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fclt_df_mips64el;
          }
        }
        else if (uVar12 == 0x7900001b) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fmadd_df_mips64el;
        }
        else if (uVar12 == 0x7900001c) {
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_mul_q_df_mips64el;
        }
        else {
          if (uVar12 != 0x7940001a) goto LAB_009b69c2;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fcult_df_mips64el;
        }
      }
      else if ((int)uVar12 < 0x7980001a) {
        if (uVar12 == 0x7940001b) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fmsub_df_mips64el;
        }
        else {
          if (uVar12 != 0x7940001c) goto LAB_009b69c2;
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_madd_q_df_mips64el;
        }
      }
      else if (uVar12 == 0x7980001a) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_fcle_df_mips64el;
      }
      else if (uVar12 == 0x7980001c) {
        tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar3 + 1));
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_msub_q_df_mips64el;
      }
      else {
        if (uVar12 != 0x79c0001a) goto LAB_009b69c2;
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_fcule_df_mips64el;
      }
LAB_009b696c:
      local_48 = pTVar8 + (long)&tcg_ctx->pool_cur;
      local_50 = pTVar7 + (long)&tcg_ctx->pool_cur;
      local_58 = (TCGv_i64)(pTVar4 + (long)&tcg_ctx->pool_cur);
      local_60 = (TCGTemp *)((long)tcg_ctx + (long)pTVar6);
      tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,5,&local_68);
    }
    else {
      if ((int)uVar12 < 0x7b00001a) {
        if ((int)uVar12 < 0x7a80001a) {
          if ((int)uVar12 < 0x7a00001b) {
            if (uVar12 == 0x79c0001b) {
              local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
              pcVar14 = helper_msa_fexp2_df_mips64el;
            }
            else {
              if (uVar12 != 0x7a00001a) goto LAB_009b69c2;
              local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
              pcVar14 = helper_msa_fsaf_df_mips64el;
            }
          }
          else if (uVar12 == 0x7a00001b) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fexdo_df_mips64el;
          }
          else if (uVar12 == 0x7a40001a) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fsun_df_mips64el;
          }
          else {
            if (uVar12 != 0x7a40001c) goto LAB_009b69c2;
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fsor_df_mips64el;
          }
        }
        else if ((int)uVar12 < 0x7a80001c) {
          if (uVar12 == 0x7a80001a) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fseq_df_mips64el;
          }
          else {
            if (uVar12 != 0x7a80001b) goto LAB_009b69c2;
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_ftq_df_mips64el;
          }
        }
        else if (uVar12 == 0x7a80001c) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fsune_df_mips64el;
        }
        else if (uVar12 == 0x7ac0001a) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fsueq_df_mips64el;
        }
        else {
          if (uVar12 != 0x7ac0001c) goto LAB_009b69c2;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fsne_df_mips64el;
        }
        goto LAB_009b696c;
      }
      if (0x7b40001b < (int)uVar12) {
        if ((int)uVar12 < 0x7b80001c) {
          if (uVar12 == 0x7b40001c) {
            tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar3 + 1));
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_maddr_q_df_mips64el;
          }
          else if (uVar12 == 0x7b80001a) {
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fsle_df_mips64el;
          }
          else {
            if (uVar12 != 0x7b80001b) goto LAB_009b69c2;
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_fmax_df_mips64el;
          }
        }
        else if (uVar12 == 0x7b80001c) {
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_msubr_q_df_mips64el;
        }
        else if (uVar12 == 0x7bc0001a) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fsule_df_mips64el;
        }
        else {
          if (uVar12 != 0x7bc0001b) goto LAB_009b69c2;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fmax_a_df_mips64el;
        }
        goto LAB_009b696c;
      }
      if (0x7b00001b < (int)uVar12) {
        if (uVar12 == 0x7b00001c) {
          tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_mulr_q_df_mips64el;
        }
        else if (uVar12 == 0x7b40001a) {
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fsult_df_mips64el;
        }
        else {
          if (uVar12 != 0x7b40001b) goto LAB_009b69c2;
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          pcVar14 = helper_msa_fmin_a_df_mips64el;
        }
        goto LAB_009b696c;
      }
      if (uVar12 == 0x7b00001a) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_fslt_df_mips64el;
        goto LAB_009b696c;
      }
      if (uVar12 == 0x7b00001b) {
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_fmin_df_mips64el;
        goto LAB_009b696c;
      }
LAB_009b69c2:
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    pTVar5 = (TCGTemp *)(pTVar8 + (long)tcg_ctx);
    goto LAB_009b69a0;
  case 0x7800001e:
    uVar12 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar12 & 0xffe0003f;
    if ((int)uVar3 < 0x7880001e) {
      if ((int)uVar3 < 0x7840001e) {
        if ((uVar3 != 0x7800001e) && (uVar3 != 0x7820001e)) {
switchD_009b42d5_caseD_78000003:
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
          return;
        }
      }
      else if ((uVar3 != 0x7840001e) && (uVar3 != 0x7860001e)) goto switchD_009b42d5_caseD_78000003;
LAB_009b52b5:
      tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
      local_78 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
      pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & 0x1f);
      uVar9 = (ulong)((uint)(env->active_tc).gpr[7] & 0xffe0003f) - 0x7800001e;
      switch(uVar9 << 0x2b | uVar9 >> 0x15) {
      case 0:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_and_v_mips64el;
        break;
      case 1:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_or_v_mips64el;
        break;
      case 2:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_nor_v_mips64el;
        break;
      case 3:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_xor_v_mips64el;
        break;
      case 4:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_bmnz_v_mips64el;
        break;
      case 5:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_bmz_v_mips64el;
        break;
      case 6:
        local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar14 = helper_msa_bsel_v_mips64el;
        break;
      default:
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        goto LAB_009b613d;
      }
      local_50 = pTVar8 + (long)&tcg_ctx->pool_cur;
      local_58 = (TCGv_i64)(local_78 + (long)&tcg_ctx->pool_cur);
      local_60 = (TCGTemp *)(pTVar7 + (long)&tcg_ctx->pool_cur);
      tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,4,&local_68);
      goto LAB_009b613d;
    }
    if ((int)uVar3 < 0x78c0001e) {
      if ((uVar3 != 0x7880001e) && (uVar3 != 0x78a0001e)) goto switchD_009b42d5_caseD_78000003;
      goto LAB_009b52b5;
    }
    if (uVar3 != 0x7b20001e) {
      if (uVar3 == 0x7b00001e) {
        tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
        uVar3 = uVar12 >> 0x10 & 3;
        pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
        pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
        local_78 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & 0x1f);
        pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar3);
        uVar9 = (ulong)((uint)(env->active_tc).gpr[7] & 0xfffc003f) - 0x7b00001e;
        switch(uVar9 << 0x2e | uVar9 >> 0x12) {
        case 0:
          local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_60 = (TCGTemp *)(pTVar8 + (long)&tcg_ctx->pool_cur);
          local_58 = (TCGv_i64)(pTVar4 + (long)&tcg_ctx->pool_cur);
          local_50 = pTVar7 + (long)&tcg_ctx->pool_cur;
          pcVar14 = helper_msa_fill_df_mips64el;
          goto LAB_009b4cf2;
        case 1:
          switch(uVar3) {
          case 0:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_pcnt_b_mips64el;
            break;
          case 1:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_pcnt_h_mips64el;
            break;
          case 2:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_pcnt_w_mips64el;
            break;
          case 3:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_pcnt_d_mips64el;
          }
          break;
        case 2:
          switch(uVar3) {
          case 0:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nloc_b_mips64el;
            break;
          case 1:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nloc_h_mips64el;
            break;
          case 2:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nloc_w_mips64el;
            break;
          case 3:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nloc_d_mips64el;
          }
          break;
        case 3:
          switch(uVar3) {
          case 0:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nlzc_b_mips64el;
            break;
          case 1:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nlzc_h_mips64el;
            break;
          case 2:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nlzc_w_mips64el;
            break;
          case 3:
            local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            pcVar14 = helper_msa_nlzc_d_mips64el;
          }
          break;
        default:
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
          goto LAB_009b57b7;
        }
        local_58 = (TCGv_i64)(pTVar7 + (long)&tcg_ctx->pool_cur);
        local_60 = (TCGTemp *)(pTVar4 + (long)&tcg_ctx->pool_cur);
        iVar13 = 3;
        goto LAB_009b7273;
      }
      if (uVar3 != 0x78c0001e) goto switchD_009b42d5_caseD_78000003;
      goto LAB_009b52b5;
    }
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 6 & 0x1f);
    pTVar7 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0xb & 0x1f);
    pTVar8 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & 0x1f);
    pTVar10 = tcg_const_i32_mips64el(tcg_ctx,uVar12 >> 0x10 & 1 | 2);
    uVar9 = (ulong)((uint)(env->active_tc).gpr[7] & 0xfffe003f) - 0x7b20001e;
    switch(uVar9 << 0x2f | uVar9 >> 0x11) {
    case 0:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_fclass_df_mips64el;
      break;
    case 1:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ftrunc_s_df_mips64el;
      break;
    case 2:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ftrunc_u_df_mips64el;
      break;
    case 3:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_fsqrt_df_mips64el;
      break;
    case 4:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_frsqrt_df_mips64el;
      break;
    case 5:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_frcp_df_mips64el;
      break;
    case 6:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_frint_df_mips64el;
      break;
    case 7:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_flog2_df_mips64el;
      break;
    case 8:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_fexupl_df_mips64el;
      break;
    case 9:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_fexupr_df_mips64el;
      break;
    case 10:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ffql_df_mips64el;
      break;
    case 0xb:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ffqr_df_mips64el;
      break;
    case 0xc:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ftint_s_df_mips64el;
      break;
    case 0xd:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ftint_u_df_mips64el;
      break;
    case 0xe:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ffint_s_df_mips64el;
      break;
    case 0xf:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ffint_u_df_mips64el;
      break;
    default:
      goto switchD_009b5e3c_default;
    }
    local_50 = pTVar7 + (long)&tcg_ctx->pool_cur;
    local_58 = (TCGv_i64)(pTVar4 + (long)&tcg_ctx->pool_cur);
    local_60 = (TCGTemp *)(pTVar10 + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,4,&local_68);
switchD_009b5e3c_default:
    pTVar5 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
LAB_009b4d9c:
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar5);
    break;
  case 0x78000020:
  case 0x78000021:
  case 0x78000022:
  case 0x78000023:
  case 0x78000024:
  case 0x78000025:
  case 0x78000026:
  case 0x78000027:
    uVar3 = (uint)(env->active_tc).gpr[7];
    pTVar4 = tcg_const_i32_mips64el(tcg_ctx,uVar3 >> 6 & 0x1f);
    pTVar5 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
    pTVar6 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    gen_base_offset_addr
              ((DisasContext_conflict6 *)env,pTVar6,uVar3 >> 0xb & 0x1f,
               ((int)(uVar3 << 6) >> 0x16) << ((byte)uVar3 & 3));
    switch(uVar12) {
    case 0x78000020:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ld_b_mips64el;
      break;
    case 0x78000021:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ld_h_mips64el;
      break;
    case 0x78000022:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ld_w_mips64el;
      break;
    case 0x78000023:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_ld_d_mips64el;
      break;
    case 0x78000024:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_st_b_mips64el;
      break;
    case 0x78000025:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_st_h_mips64el;
      break;
    case 0x78000026:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_st_w_mips64el;
      break;
    case 0x78000027:
      local_68 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar14 = helper_msa_st_d_mips64el;
      break;
    default:
      goto switchD_009b4370_default;
    }
    local_58 = (TCGv_i64)((long)tcg_ctx + (long)pTVar6);
    local_60 = (TCGTemp *)(pTVar4 + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_mips64el(tcg_ctx,pcVar14,(TCGTemp *)0x0,3,&local_68);
switchD_009b4370_default:
    pTVar5 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
LAB_009b69a0:
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar5);
    pTVar5 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    goto LAB_009b69ae;
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar8 + (long)tcg_ctx));
  pTVar5 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
LAB_009b69ae:
  tcg_temp_free_internal_mips64el(tcg_ctx,pTVar5);
  return;
}

Assistant:

static void gen_msa(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t opcode = ctx->opcode;
    check_insn(ctx, ASE_MSA);
    check_msa_access(ctx);

    switch (MASK_MSA_MINOR(opcode)) {
    case OPC_MSA_I8_00:
    case OPC_MSA_I8_01:
    case OPC_MSA_I8_02:
        gen_msa_i8(env, ctx);
        break;
    case OPC_MSA_I5_06:
    case OPC_MSA_I5_07:
        gen_msa_i5(env, ctx);
        break;
    case OPC_MSA_BIT_09:
    case OPC_MSA_BIT_0A:
        gen_msa_bit(env, ctx);
        break;
    case OPC_MSA_3R_0D:
    case OPC_MSA_3R_0E:
    case OPC_MSA_3R_0F:
    case OPC_MSA_3R_10:
    case OPC_MSA_3R_11:
    case OPC_MSA_3R_12:
    case OPC_MSA_3R_13:
    case OPC_MSA_3R_14:
    case OPC_MSA_3R_15:
        gen_msa_3r(env, ctx);
        break;
    case OPC_MSA_ELM:
        gen_msa_elm(env, ctx);
        break;
    case OPC_MSA_3RF_1A:
    case OPC_MSA_3RF_1B:
    case OPC_MSA_3RF_1C:
        gen_msa_3rf(env, ctx);
        break;
    case OPC_MSA_VEC:
        gen_msa_vec(env, ctx);
        break;
    case OPC_LD_B:
    case OPC_LD_H:
    case OPC_LD_W:
    case OPC_LD_D:
    case OPC_ST_B:
    case OPC_ST_H:
    case OPC_ST_W:
    case OPC_ST_D:
        {
            int32_t s10 = sextract32(ctx->opcode, 16, 10);
            uint8_t rs = (ctx->opcode >> 11) & 0x1f;
            uint8_t wd = (ctx->opcode >> 6) & 0x1f;
            uint8_t df = (ctx->opcode >> 0) & 0x3;

            TCGv_i32 twd = tcg_const_i32(tcg_ctx, wd);
            TCGv taddr = tcg_temp_new(tcg_ctx);
            gen_base_offset_addr(ctx, taddr, rs, s10 << df);

            switch (MASK_MSA_MINOR(opcode)) {
            case OPC_LD_B:
                gen_helper_msa_ld_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_H:
                gen_helper_msa_ld_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_W:
                gen_helper_msa_ld_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_D:
                gen_helper_msa_ld_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_B:
                gen_helper_msa_st_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_H:
                gen_helper_msa_st_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_W:
                gen_helper_msa_st_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_D:
                gen_helper_msa_st_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            }

            tcg_temp_free_i32(tcg_ctx, twd);
            tcg_temp_free(tcg_ctx, taddr);
        }
        break;
    default:
        MIPS_INVAL("MSA instruction");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

}